

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O0

void init_simd(void)

{
  int iVar1;
  char *pcVar2;
  char *env;
  
  if (simd_support == 0xffffffff) {
    simd_support = jpeg_simd_cpu_support();
    pcVar2 = getenv("JSIMD_FORCESSE2");
    if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(pcVar2,"1"), iVar1 == 0)) {
      simd_support = simd_support & 8;
    }
    pcVar2 = getenv("JSIMD_FORCEAVX2");
    if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(pcVar2,"1"), iVar1 == 0)) {
      simd_support = simd_support & 0x80;
    }
    pcVar2 = getenv("JSIMD_FORCENONE");
    if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(pcVar2,"1"), iVar1 == 0)) {
      simd_support = 0;
    }
    pcVar2 = getenv("JSIMD_NOHUFFENC");
    if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(pcVar2,"1"), iVar1 == 0)) {
      simd_huffman = 0;
    }
  }
  return;
}

Assistant:

LOCAL(void)
init_simd(void)
{
#ifndef NO_GETENV
  char *env = NULL;
#endif

  if (simd_support != ~0U)
    return;

  simd_support = jpeg_simd_cpu_support();

#ifndef NO_GETENV
  /* Force different settings through environment variables */
  env = getenv("JSIMD_FORCESSE2");
  if ((env != NULL) && (strcmp(env, "1") == 0))
    simd_support &= JSIMD_SSE2;
  env = getenv("JSIMD_FORCEAVX2");
  if ((env != NULL) && (strcmp(env, "1") == 0))
    simd_support &= JSIMD_AVX2;
  env = getenv("JSIMD_FORCENONE");
  if ((env != NULL) && (strcmp(env, "1") == 0))
    simd_support = 0;
  env = getenv("JSIMD_NOHUFFENC");
  if ((env != NULL) && (strcmp(env, "1") == 0))
    simd_huffman = 0;
#endif
}